

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Waving.h
# Opt level: O0

void __thiscall
WavingSketch<8U,_1U,_4U>::Check
          (WavingSketch<8U,_1U,_4U> *this,HashMap<4U> *mp,Abstract<4U> *another,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  const_reference ppbVar5;
  ostream *poVar6;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *in_RCX;
  long *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  int size;
  int hit;
  int all;
  int value;
  iterator it;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_ffffffffffffff78;
  _Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *in_stack_ffffffffffffff80;
  double dVar7;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_48;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_28;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_20;
  long *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::_Node_iterator
            ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x1136da);
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  local_38 = 0;
  local_40._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::begin(in_stack_ffffffffffffff78);
  local_28._M_cur = local_40._M_cur;
  while( true ) {
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::end(in_stack_ffffffffffffff78);
    bVar2 = std::__detail::operator!=(&local_28,&local_48);
    if (!bVar2) break;
    ppVar4 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x113744);
    iVar3 = (**(code **)(*in_RDI + 8))(in_RDI,ppVar4,in_RSI);
    plVar1 = local_18;
    ppVar4 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x11376f);
    local_2c = (**(code **)(*plVar1 + 8))(plVar1,ppVar4,in_RSI);
    local_2c = iVar3 - local_2c;
    if (local_2c < 1) {
      local_2c = -local_2c;
    }
    ppVar4 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x11379f);
    iVar3 = ppVar4->second;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    if (((int)in_RDI[0xd] < iVar3) && (local_30 = local_30 + 1, (int)in_RDI[0xd] < local_2c)) {
      local_34 = local_34 + 1;
    }
    if ((int)in_RDI[0xd] < local_2c) {
      local_38 = local_38 + 1;
    }
    std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator++
              (in_stack_ffffffffffffff80);
  }
  in_RDI[6] = (long)((double)local_34 / (double)local_30);
  in_RDI[5] = (long)((double)local_34 / (double)local_38);
  ppbVar5 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_20,0);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar5,(double)in_RDI[6]);
  std::operator<<(poVar6,",");
  ppbVar5 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_20,1);
  poVar6 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar5,(double)in_RDI[5]);
  std::operator<<(poVar6,",");
  ppbVar5 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_20,2);
  if (1e-09 <= (double)in_RDI[5] + (double)in_RDI[6]) {
    dVar7 = (double)in_RDI[5] + (double)in_RDI[6];
  }
  else {
    dVar7 = 1.0;
  }
  poVar6 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)*ppbVar5,((double)in_RDI[5] * 2.0 * (double)in_RDI[6]) / dVar7);
  std::operator<<(poVar6,",");
  return;
}

Assistant:

virtual void Check(HashMap<DATA_LEN> mp, Abstract<DATA_LEN>* another, const std::vector<std::ostream*>& outs) {
		typename HashMap<DATA_LEN>::iterator it;
		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			value = abs((Query(it->first, mp) - another->Query(it->first, mp)));
			if (abs(it->second) > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
				}
			}
			if (value > this->HIT) size += 1;
		}
		this->cr = hit / (double)all;
		this->pr = hit / (double)size;
		*outs[0] << this->cr << ",";
		*outs[1] << this->pr << ",";
		*outs[2] << 2 * this->pr * this->cr / ((this->pr + this->cr < 1e-9) ? 1.0 : this->pr + this->cr) << ",";
		// cout << all << " " << size << endl;
		// cout << this->cr << " " << this->pr << endl;
	}